

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void __thiscall cmCacheManager::CacheEntry::SetProperty(CacheEntry *this,string *p,bool v)

{
  allocator<char> local_55 [19];
  byte local_42;
  allocator<char> local_41;
  string local_40;
  undefined1 local_19;
  string *psStack_18;
  bool v_local;
  string *p_local;
  CacheEntry *this_local;
  
  local_42 = 0;
  local_19 = v;
  psStack_18 = p;
  p_local = &this->Value;
  if (!v) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"OFF",local_55);
  }
  else {
    std::allocator<char>::allocator();
    local_42 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"ON",&local_41);
  }
  SetProperty(this,p,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (!v) {
    std::allocator<char>::~allocator(local_55);
  }
  if ((local_42 & 1) != 0) {
    std::allocator<char>::~allocator(&local_41);
  }
  return;
}

Assistant:

void cmCacheManager::CacheEntry::SetProperty(const std::string& p, bool v)
{
  this->SetProperty(p, v ? std::string{ "ON" } : std::string{ "OFF" });
}